

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-point.hpp
# Opt level: O0

ostream * __thiscall
diy::DynamicPoint<float,_4UL>::operator<<(DynamicPoint<float,_4UL> *this,ostream *out)

{
  uint uVar1;
  const_reference pfVar2;
  ostream *this_00;
  ostream *in_RSI;
  size_t i;
  size_type in_stack_ffffffffffffffc8;
  small_vector<float,_4UL,_0UL,_std::allocator<float>_> *in_stack_ffffffffffffffd0;
  small_vector<float,_4UL,_0UL,_std::allocator<float>_> *this_01;
  small_vector<float,_4UL,_0UL,_std::allocator<float>_> *local_18;
  
  pfVar2 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                     (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::ostream::operator<<(in_RSI,*pfVar2);
  local_18 = (small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)0x1;
  while( true ) {
    this_01 = local_18;
    uVar1 = dimension((DynamicPoint<float,_4UL> *)0x1aae86);
    if ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)(ulong)uVar1 <= this_01) break;
    this_00 = std::operator<<(in_RSI," ");
    pfVar2 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                       (this_01,(size_type)this_00);
    std::ostream::operator<<(this_00,*pfVar2);
    local_18 = (small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)&local_18->field_0x1;
  }
  return in_RSI;
}

Assistant:

std::ostream&       operator<<(std::ostream& out) const     { out << (*this)[0]; for (size_t i = 1; i < dimension(); ++i) out << " " << (*this)[i]; return out; }